

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O2

int __thiscall pg::SPMSolver::pm_cycles(SPMSolver *this,int *a,int pl)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)this->k;
  for (uVar2 = ~(uint)((ulong)(uVar2 & 1) == (long)pl) + uVar2;
      (uVar1 = 0xffffffff, -1 < (int)uVar2 && (uVar1 = uVar2, a[uVar2] <= this->counts[uVar2]));
      uVar2 = uVar2 - 2) {
  }
  return uVar1;
}

Assistant:

int
SPMSolver::pm_cycles(int *a, int pl)
{
    int m = k-1;
    if ((k&1)==pl) m--;
    for (int i=m; i>=0; i-=2) {
        if (a[i] > counts[i]) return i;
    }
    return -1;
}